

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeInfo.cpp
# Opt level: O2

ScopeInfo *
Js::ScopeInfo::SaveOneScopeInfo
          (ByteCodeGenerator *byteCodeGenerator,Scope *scope,ScriptContext *scriptContext)

{
  Symbol *pSVar1;
  code *pcVar2;
  ushort uVar3;
  ushort uVar4;
  bool bVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  undefined4 *puVar9;
  Recycler *alloc;
  ScopeInfo *this;
  ushort uVar10;
  ushort uVar11;
  char16_t *pcVar12;
  ushort uVar13;
  Symbol *sym;
  undefined1 local_60 [8];
  MapSymbolData mapSymbolData;
  uint local_34 [2];
  int count;
  
  if (scope->scopeInfo != (ScopeInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                ,0x3a,"(scope->GetScopeInfo() == nullptr)",
                                "scope->GetScopeInfo() == nullptr");
    if (!bVar5) goto LAB_007dc905;
    *puVar9 = 0;
  }
  if (scope->scopeType == ScopeType_Global) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                ,0x3b,"(scope->GetScopeType() != ScopeType_Global)",
                                "scope->GetScopeType() != ScopeType_Global");
    if (!bVar5) {
LAB_007dc905:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  local_34[0] = scope->m_count;
  AddSlotCount((int *)local_34,scope->func->argsPlaceHolderSlotCount);
  mapSymbolData.byteCodeGenerator = (ByteCodeGenerator *)((long)(int)local_34[0] << 4);
  local_60 = (undefined1  [8])&typeinfo;
  mapSymbolData.func = (FuncInfo *)0xffffffffffffffff;
  mapSymbolData._16_8_ = anon_var_dwarf_39850a7;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  uVar13 = 0;
  this = (ScopeInfo *)new<Memory::Recycler>(0x30,alloc,0x398e98,0);
  ScopeInfo(this,(scope->func->byteCodeFunction->super_FunctionProxy).functionInfo.ptr,local_34[0]);
  this->scopeType = scope->scopeType;
  uVar6 = *(ushort *)&scope->field_0x44 & 1;
  uVar3 = (ushort)*(undefined4 *)&this->field_0x10;
  *(ushort *)&this->field_0x10 = uVar3 & 0xfffe | uVar6;
  uVar7 = *(ushort *)&scope->field_0x44 & 2;
  *(ushort *)&this->field_0x10 = uVar3 & 0xfffc | uVar6 | uVar7;
  uVar8 = *(ushort *)&scope->field_0x44 >> 2 & 4;
  *(ushort *)&this->field_0x10 = uVar3 & 0xfff8 | uVar6 | uVar7 | uVar8;
  if (scope->func->bodyScope == scope) {
    uVar13 = *(ushort *)&scope->func->field_0xb4 >> 5 & 8;
  }
  *(ushort *)&this->field_0x10 = uVar13 | uVar3 & 0xfff0 | uVar6 | uVar7 | uVar8;
  uVar10 = *(ushort *)&scope->field_0x44 >> 3 & 0x20;
  *(ushort *)&this->field_0x10 = uVar13 | uVar3 & 0xffd0 | uVar6 | uVar7 | uVar8 | uVar10;
  if (scope->scopeType == ScopeType_FunctionBody) {
    uVar11 = *(byte *)((long)&((scope->func->byteCodeFunction->super_FunctionProxy).functionInfo.ptr
                              )->attributes + 1) & 0x40;
    *(ushort *)&this->field_0x10 = uVar13 | uVar3 & 0xff90 | uVar6 | uVar7 | uVar8 | uVar10 | uVar11
    ;
    uVar4 = (ushort)(((scope->func->byteCodeFunction->super_FunctionProxy).functionInfo.ptr)->
                     attributes >> 9) & 0x80;
    *(ushort *)&this->field_0x10 =
         uVar13 | uVar3 & 0xff10 | uVar6 | uVar7 | uVar8 | uVar10 | uVar11 | uVar4;
    *(ushort *)&this->field_0x10 =
         uVar13 | uVar3 & 0xfe10 | uVar6 | uVar7 | uVar8 | uVar10 | uVar11 | uVar4 |
         (ushort)(short)((scope->func->byteCodeFunction->super_FunctionProxy).functionInfo.ptr)->
                        attributes >> 2 & 0x100;
  }
  bVar5 = Phases::IsEnabled((Phases *)&DAT_01453738,ByteCodePhase);
  if (bVar5) {
    pcVar12 = L"isObject";
    if ((*(ushort *)&this->field_0x10 & 2) == 0) {
      pcVar12 = L"";
    }
    Output::Print(L"\nSave ScopeInfo: %s #symbols: %d %s\n",scope->func->name,(ulong)local_34[0],
                  pcVar12);
  }
  mapSymbolData.byteCodeGenerator = (ByteCodeGenerator *)scope->func;
  mapSymbolData.func = (FuncInfo *)((ulong)mapSymbolData.func & 0xffffffff00000000);
  sym = scope->m_symList;
  local_60 = (undefined1  [8])byteCodeGenerator;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    if (sym == (Symbol *)0x0) {
      scope->scopeInfo = this;
      return this;
    }
    pSVar1 = sym->next;
    if (sym->scope != scope) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                  ,0x5a,"(scope == sym->GetScope())","scope == sym->GetScope()");
      if (!bVar5) goto LAB_007dc905;
      *puVar9 = 0;
    }
    SaveSymbolInfo(this,sym,(MapSymbolData *)local_60);
    sym = pSVar1;
  } while( true );
}

Assistant:

ScopeInfo* ScopeInfo::SaveOneScopeInfo(ByteCodeGenerator* byteCodeGenerator, Scope* scope, ScriptContext *scriptContext)
    {
        Assert(scope->GetScopeInfo() == nullptr);
        Assert(scope->GetScopeType() != ScopeType_Global);

        int count = scope->Count();

        // Add argsPlaceHolder which includes same name args and destructuring patterns on parameters
        AddSlotCount(count, scope->GetFunc()->argsPlaceHolderSlotCount);

        ScopeInfo* scopeInfo = RecyclerNewPlusZ(scriptContext->GetRecycler(),
            count * sizeof(SymbolInfo),
            ScopeInfo, scope->GetFunc()->byteCodeFunction->GetFunctionInfo(),/*parent ? parent->GetFunctionInfo() : nullptr,*/ count);
        scopeInfo->SetScopeType(scope->GetScopeType());
        scopeInfo->isDynamic = scope->GetIsDynamic();
        scopeInfo->isObject = scope->GetIsObject();
        scopeInfo->mustInstantiate = scope->GetMustInstantiate();
        scopeInfo->isCached = (scope->GetFunc()->GetBodyScope() == scope) && scope->GetFunc()->GetHasCachedScope();
        scopeInfo->hasLocalInClosure = scope->GetHasOwnLocalInClosure();

        if (scope->GetScopeType() == ScopeType_FunctionBody)
        {
            scopeInfo->isGeneratorFunctionBody = scope->GetFunc()->byteCodeFunction->GetFunctionInfo()->IsGenerator();
            scopeInfo->isAsyncFunctionBody = scope->GetFunc()->byteCodeFunction->GetFunctionInfo()->IsAsync();
            scopeInfo->isClassConstructor = scope->GetFunc()->byteCodeFunction->GetFunctionInfo()->IsClassConstructor();
        }

        TRACE_BYTECODE(_u("\nSave ScopeInfo: %s #symbols: %d %s\n"),
            scope->GetFunc()->name, count,
            scopeInfo->isObject ? _u("isObject") : _u(""));

        MapSymbolData mapSymbolData = { byteCodeGenerator, scope->GetFunc(), 0 };
        scope->ForEachSymbol([&mapSymbolData, scopeInfo, scope](Symbol * sym)
        {
            Assert(scope == sym->GetScope());
            scopeInfo->SaveSymbolInfo(sym, &mapSymbolData);
        });

        scope->SetScopeInfo(scopeInfo);

        return scopeInfo;
    }